

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

PropertyIndex
Js::DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(PropertyIndex slotCapacity)

{
  PropertyIndex PVar1;
  undefined2 local_a;
  PropertyIndex objectHeaderInlinableSlotCapacity;
  PropertyIndex slotCapacity_local;
  
  local_a = GetObjectHeaderInlinableSlotCapacity();
  if (local_a < slotCapacity) {
    PVar1 = RoundUpInlineSlotCapacity(slotCapacity - local_a);
    local_a = PVar1 + local_a;
  }
  return local_a;
}

Assistant:

PropertyIndex DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(const PropertyIndex slotCapacity)
    {
        const PropertyIndex objectHeaderInlinableSlotCapacity = GetObjectHeaderInlinableSlotCapacity();
        if(slotCapacity <= objectHeaderInlinableSlotCapacity)
        {
            return objectHeaderInlinableSlotCapacity;
        }

        // Align the slot capacity for slots that are outside the object header, and add to that the slot capacity for slots
        // that are inside the object header
        return RoundUpInlineSlotCapacity(slotCapacity - objectHeaderInlinableSlotCapacity) + objectHeaderInlinableSlotCapacity;
    }